

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_wav_f32_to_s16(ma_int16 *pOut,float *pIn,size_t sampleCount)

{
  float local_38;
  float local_34;
  float c;
  float x;
  size_t i;
  int r;
  size_t sampleCount_local;
  float *pIn_local;
  ma_int16 *pOut_local;
  
  for (i = 0; i < sampleCount; i = i + 1) {
    local_38 = pIn[i];
    if (-1.0 <= local_38) {
      if (1.0 < local_38) {
        local_38 = 1.0;
      }
      local_34 = local_38;
    }
    else {
      local_34 = -1.0;
    }
    pOut[i] = (short)(int)((local_34 + 1.0) * 32767.5) + -0x8000;
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_f32_to_s16(ma_int16* pOut, const float* pIn, size_t sampleCount)
{
    int r;
    size_t i;
    for (i = 0; i < sampleCount; ++i) {
        float x = pIn[i];
        float c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5f);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}